

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

void __thiscall CGameConsole::OnRender(CGameConsole *this)

{
  char **ppcVar1;
  uint uVar2;
  IGraphics *pIVar3;
  IClient *pIVar4;
  ITextRender *pIVar5;
  IConsole *pIVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  CUIRect *pCVar13;
  char *pcVar14;
  float *pCurrent;
  CGameConsole *pCVar15;
  CInstance *pCVar16;
  CGameConsole *this_00;
  char *pcVar17;
  long in_FS_OFFSET;
  float fVar18;
  float fVar19;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar20;
  float fVar21;
  float fVar22;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar23;
  float fVar24;
  float fVar25;
  CCompletionOptionRenderInfo Info;
  char aBuf [128];
  float local_2e8;
  float local_2e4;
  CGameConsole *local_2d0;
  CTextCursor *local_2c8;
  char **local_2c0;
  undefined4 local_2b8;
  int local_2b4;
  undefined4 local_2b0;
  char *local_2a8;
  float local_2a0;
  float local_29c;
  long local_298;
  float local_290;
  float local_28c;
  char local_288 [512];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined4 local_60;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar15 = (CGameConsole *)&((this->super_CComponent).m_pClient)->m_UI;
  pCVar13 = CUI::Screen((CUI *)pCVar15);
  fVar21 = pCVar13->x;
  fVar22 = pCVar13->y;
  fVar25 = pCVar13->w;
  fVar24 = pCVar13->h;
  fVar18 = TimeNow(pCVar15);
  local_2e4 = (fVar18 - (this->m_StateChangeEnd - this->m_StateChangeDuration)) /
              this->m_StateChangeDuration;
  if (1.0 <= local_2e4) {
    local_2e4 = 1.0;
    if (this->m_ConsoleState == 1) {
      this->m_ConsoleState = 2;
      pCVar16 = &this->m_LocalConsole;
      if (this->m_ConsoleType == 1) {
        pCVar16 = &this->m_RemoteConsole;
      }
      CLineInput::Activate(&pCVar16->m_Input,CONSOLE);
    }
    else if (this->m_ConsoleState == 3) {
      this->m_ConsoleState = 0;
      pCVar16 = &this->m_LocalConsole;
      if (this->m_ConsoleType == 1) {
        pCVar16 = &this->m_RemoteConsole;
      }
      CLineInput::Deactivate(&pCVar16->m_Input);
    }
  }
  if ((this->m_ConsoleState == 2) &&
     (((this->super_CComponent).m_pClient)->m_pConfig->m_ClEditor != 0)) {
    Toggle(this,0);
  }
  if (this->m_ConsoleState == 0) goto LAB_0013db82;
  if (this->m_ConsoleState == 2) {
    (*(((this->super_CComponent).m_pClient)->m_pInput->super_IInterface)._vptr_IInterface[10])();
  }
  if (this->m_ConsoleState == 3) {
    local_2e4 = local_2e4 + -1.0 + 1.0;
LAB_0013cec6:
    fVar19 = acosf(local_2e4);
    fVar19 = sinf(fVar19);
  }
  else {
    fVar19 = 1.0;
    if (this->m_ConsoleState == 1) {
      local_2e4 = 1.0 - local_2e4;
      goto LAB_0013cec6;
    }
  }
  fVar19 = ((fVar24 * 3.0) / 5.0) * fVar19;
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[5])
            (fVar21,fVar22,fVar25,fVar24);
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])(pIVar3,0xffffffff);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0x13f000000;
  local_70 = 0;
  uStack_68 = 0x3f00000000000000;
  local_60 = 2;
  local_5c = 0;
  uStack_54 = 0;
  local_4c = 3;
  local_48 = 0;
  uStack_40 = 0;
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x20])(pIVar3,&local_88,4);
  local_298 = (ulong)(uint)fVar19 << 0x20;
  local_28c = 10.0;
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  local_290 = fVar25;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,&local_298,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])
            (pIVar3,(ulong)(uint)g_pData->m_aImages[9].m_Id.m_Id);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
            (0x3e4ccccd,0x3e4ccccd,0x3e4ccccd,0x3f666666);
  if (this->m_ConsoleType == 1) {
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
              (0x3ecccccd,0x3e4ccccd,0x3e4ccccd,0x3f666666);
  }
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x1a])
            (0,fVar19 * -0.075,fVar25 * 0.075 * 0.5,0,pIVar3,0xffffffff);
  local_298 = 0;
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  local_290 = fVar25;
  local_28c = fVar19;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,&local_298,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])(pIVar3,0xffffffff);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0x100000000;
  local_70 = 0;
  uStack_68 = 0;
  local_60 = 2;
  local_5c = 0;
  uStack_54 = 0x3e80000000000000;
  local_4c = 3;
  local_48 = 0;
  uStack_40 = 0x3e80000000000000;
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x20])(pIVar3,&local_88,4);
  local_298 = (ulong)(uint)(fVar19 + -20.0) << 0x20;
  local_28c = 10.0;
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  local_290 = fVar25;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,&local_298,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])
            (pIVar3,(ulong)(uint)g_pData->m_aImages[10].m_Id.m_Id);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
            (0x3f800000,0x3f800000,0x3f800000,0x3f666666);
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x1a])
            (0,0x3dcccccd,fVar25 * 0.015,0x3f666666,pIVar3,0xffffffff);
  local_298 = (ulong)(uint)(fVar19 + -10.0) << 0x20;
  local_28c = 10.0;
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  local_290 = fVar25;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,&local_298,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  pCVar15 = (CGameConsole *)&this->m_LocalConsole;
  if (this->m_ConsoleType == 1) {
    pCVar15 = (CGameConsole *)&this->m_RemoteConsole;
  }
  if ((OnRender()::s_InfoCursor == '\0') &&
     (iVar10 = __cxa_guard_acquire(&OnRender()::s_InfoCursor), iVar10 != 0)) {
    CTextCursor::CTextCursor(&OnRender::s_InfoCursor);
    __cxa_atexit(CTextCursor::~CTextCursor,&OnRender::s_InfoCursor,&__dso_handle);
    __cxa_guard_release(&OnRender()::s_InfoCursor);
  }
  aVar20.y = fVar19 + -22.0 + -12.5 + -5.0;
  CTextCursor::Reset(&OnRender::s_InfoCursor,-1);
  OnRender::s_InfoCursor.m_CursorPos.field_1.y = aVar20.y + 12.5 + 2.0;
  OnRender::s_InfoCursor.m_CursorPos.field_0.x =
       *(float *)((pCVar15->m_LocalConsole).m_aCompletionBuffer + 0x70) + 3.0;
  OnRender::s_InfoCursor.m_FontSize = 10.0;
  OnRender::s_InfoCursor.m_MaxWidth = -1.0;
  if ((OnRender()::s_PromptCursor == '\0') &&
     (iVar10 = __cxa_guard_acquire(&OnRender()::s_PromptCursor), iVar10 != 0)) {
    CTextCursor::CTextCursor(&OnRender::s_PromptCursor,10.0,0);
    __cxa_atexit(CTextCursor::~CTextCursor,&OnRender::s_PromptCursor,&__dso_handle);
    __cxa_guard_release(&OnRender()::s_PromptCursor);
  }
  OnRender::s_PromptCursor.m_CursorPos.field_0.x = 3.0;
  OnRender::s_PromptCursor.m_CursorPos.field_1.y = aVar20.y;
  if (this->m_ConsoleType == 1) {
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pClient;
    if ((pIVar4->m_State & 0xfffffffeU) == 2) {
      iVar10 = (*(pIVar4->super_IInterface)._vptr_IInterface[0x1a])();
      pcVar17 = "ENTER PASSWORD> ";
      if ((char)iVar10 != '\0') {
        pcVar17 = "rcon> ";
      }
    }
    else {
      pcVar17 = "NOT CONNECTED> ";
    }
  }
  else {
    pcVar17 = "> ";
  }
  CTextCursor::Reset(&OnRender::s_PromptCursor,(int64)pcVar17);
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0xb])
            (pIVar5,&OnRender::s_PromptCursor,pcVar17,0xffffffff);
  aVar23.x = OnRender::s_PromptCursor.m_CursorPos.field_0.x +
             OnRender::s_PromptCursor.m_Advance.field_0.x;
  this_00 = (CGameConsole *)((pCVar15->m_LocalConsole).m_aInputBuf + 0xe8);
  if ((this->m_ConsoleType == 1) &&
     (pIVar4 = ((this->super_CComponent).m_pClient)->m_pClient, (pIVar4->m_State & 0xfffffffeU) == 2
     )) {
    iVar10 = (*(pIVar4->super_IInterface)._vptr_IInterface[0x1a])();
    bVar9 = (byte)iVar10 ^ 1;
  }
  else {
    bVar9 = 0;
  }
  *(byte *)&(pCVar15->m_LocalConsole).m_Input.m_CursorPos = bVar9;
  (pCVar15->m_LocalConsole).m_Input.m_TextCursor.m_Glyphs.num_elements = 8;
  (pCVar15->m_LocalConsole).m_Input.m_TextCursor.m_Glyphs.list = (CScaledGlyph *)0xffffffff41200000;
  fVar21 = fVar25 + -10.0;
  (pCVar15->m_LocalConsole).m_Input.m_TextCursor.m_Glyphs.list_size = (int)(fVar21 - aVar23.x);
  (pCVar15->m_LocalConsole).m_Input.m_TextCursor.m_Width = (float)aVar23;
  (pCVar15->m_LocalConsole).m_Input.m_TextCursor.m_Height = aVar20.y + 13.5;
  CLineInput::Activate((CLineInput *)this_00,CONSOLE);
  CLineInput::Render((CLineInput *)this_00);
  iVar10 = *(int *)((pCVar15->m_LocalConsole).m_aInputBuf + 0xf8);
  if (OnRender()::s_LastRender == '\0') {
    OnRender(this_00);
  }
  if (((this->m_ConsoleType == 0) ||
      (iVar11 = (*(((this->super_CComponent).m_pClient)->m_pClient->super_IInterface).
                  _vptr_IInterface[0x1a])(), (char)iVar11 != '\0')) &&
     (**(char **)&(pCVar15->m_LocalConsole).m_Input.m_TextCursor.m_MaxWidth != '\0')) {
    local_2b8 = *(undefined4 *)((pCVar15->m_LocalConsole).m_aCompletionBuffer + 0x68);
    uVar12 = 0;
    local_2b4 = 0;
    local_2b0 = *(undefined4 *)((pCVar15->m_LocalConsole).m_aCompletionBuffer + 0x70);
    pcVar17 = (pCVar15->m_LocalConsole).m_aCompletionBuffer + 0x74;
    local_29c = 0.0;
    ppcVar1 = (char **)((pCVar15->m_LocalConsole).m_aCompletionMapBuffer + 0x6c);
    local_2c8 = &OnRender::s_InfoCursor;
    pIVar6 = this->m_pConsole;
    uVar2 = *(uint *)((pCVar15->m_LocalConsole).m_aCompletionBuffer + 0x6c);
    local_2d0 = this;
    local_2c0 = ppcVar1;
    local_2a8 = pcVar17;
    local_2a0 = fVar25;
    if (this->m_ConsoleType != 0) {
      iVar11 = (*(((this->super_CComponent).m_pClient)->m_pClient->super_IInterface).
                 _vptr_IInterface[0x1a])();
      if ((char)iVar11 == '\0') {
        uVar12 = 0;
      }
      else {
        uVar12 = (*(((this->super_CComponent).m_pClient)->m_pClient->super_IInterface).
                   _vptr_IInterface[0x1b])();
      }
    }
    (*(pIVar6->super_IInterface)._vptr_IInterface[5])
              (pIVar6,ppcVar1,(ulong)uVar2,(ulong)(uVar12 & 0xff),PossibleCommandsRenderCallback,
               &local_2d0);
    ppcVar1 = local_2c0;
    if ((local_2b4 < 1) && ((pCVar15->m_LocalConsole).m_aCompletionBuffer[0x78] == '\x01')) {
      pcVar14 = str_startswith_nocase((char *)local_2c0,"sv_map ");
      if (pcVar14 == (char *)0x0) {
        bVar7 = true;
        do {
          bVar8 = bVar7;
          if (!bVar8) goto LAB_0013d676;
          pcVar14 = str_startswith_nocase((char *)ppcVar1,"change_map ");
          bVar7 = false;
        } while (pcVar14 == (char *)0x0);
        if (bVar8) goto LAB_0013d643;
      }
      else {
LAB_0013d643:
        local_2b8 = *(undefined4 *)((pCVar15->m_LocalConsole).m_aCompletionMapBuffer + 0x68);
        local_2b4 = 0;
        local_29c = 0.0;
        local_2c0 = &(pCVar15->m_LocalConsole).m_pName;
        (*(this->m_pConsole->super_IInterface)._vptr_IInterface[6])
                  (this->m_pConsole,local_2c0,PossibleCommandsRenderCallback);
      }
LAB_0013d676:
      if ((local_2b4 < 1) && ((pCVar15->m_LocalConsole).m_aCompletionBuffer[0x78] == '\x01')) {
        str_format(local_288,0x200,"Help: %s ",(pCVar15->m_LocalConsole).m_aCommandName + 0x18);
        pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar5->super_IInterface)._vptr_IInterface[7])(pIVar5,local_2c8,local_288,0xffffffff);
        (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface
          [4])(0x3f400000,0x3f400000,0x3f400000,0x3f800000);
        str_format(local_288,0x200,"Syntax: %s %s",
                   (pCVar15->m_LocalConsole).m_aCompletionBuffer + 0x79,
                   (pCVar15->m_LocalConsole).m_aCommandHelp + 0x68);
        pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar5->super_IInterface)._vptr_IInterface[7])(pIVar5,local_2c8,local_288,0xffffffff);
      }
    }
    fVar22 = *(float *)pcVar17;
    fVar25 = -fVar22;
    if (-fVar22 <= fVar22) {
      fVar25 = fVar22;
    }
    if (local_2a0 < fVar25) {
      *(float *)((pCVar15->m_LocalConsole).m_aCompletionBuffer + 0x70) =
           fVar22 + *(float *)((pCVar15->m_LocalConsole).m_aCompletionBuffer + 0x70);
      (pCVar15->m_LocalConsole).m_aCompletionBuffer[0x74] = '\0';
      (pCVar15->m_LocalConsole).m_aCompletionBuffer[0x75] = '\0';
      (pCVar15->m_LocalConsole).m_aCompletionBuffer[0x76] = '\0';
      (pCVar15->m_LocalConsole).m_aCompletionBuffer[0x77] = '\0';
    }
    fVar22 = *(float *)pcVar17;
    if ((fVar22 != 0.0) || (NAN(fVar22))) {
      fVar24 = (fVar18 - OnRender::s_LastRender) * 10.0;
      fVar25 = 1.0;
      if (fVar24 <= 1.0) {
        fVar25 = fVar24;
      }
      fVar25 = (float)(~-(uint)(fVar24 < 0.0) & (uint)fVar25) * fVar22;
      *(float *)((pCVar15->m_LocalConsole).m_aCompletionBuffer + 0x70) =
           fVar25 + *(float *)((pCVar15->m_LocalConsole).m_aCompletionBuffer + 0x70);
      *(float *)((pCVar15->m_LocalConsole).m_aCompletionBuffer + 0x74) = fVar22 - fVar25;
    }
    if (0.0 < *(float *)((pCVar15->m_LocalConsole).m_aCompletionBuffer + 0x70)) {
      (pCVar15->m_LocalConsole).m_aCompletionBuffer[0x70] = '\0';
      (pCVar15->m_LocalConsole).m_aCompletionBuffer[0x71] = '\0';
      (pCVar15->m_LocalConsole).m_aCompletionBuffer[0x72] = '\0';
      (pCVar15->m_LocalConsole).m_aCompletionBuffer[0x73] = '\0';
      (pCVar15->m_LocalConsole).m_aCompletionBuffer[0x74] = '\0';
      (pCVar15->m_LocalConsole).m_aCompletionBuffer[0x75] = '\0';
      (pCVar15->m_LocalConsole).m_aCompletionBuffer[0x76] = '\0';
      (pCVar15->m_LocalConsole).m_aCompletionBuffer[0x77] = '\0';
    }
    if ((local_2a0 < local_29c) &&
       (fVar22 = local_2a0 - local_29c,
       pcVar17 = (pCVar15->m_LocalConsole).m_aCompletionBuffer + 0x70,
       *(float *)pcVar17 <= fVar22 && fVar22 != *(float *)pcVar17)) {
      *(float *)((pCVar15->m_LocalConsole).m_aCompletionBuffer + 0x70) = fVar22;
      (pCVar15->m_LocalConsole).m_aCompletionBuffer[0x74] = '\0';
      (pCVar15->m_LocalConsole).m_aCompletionBuffer[0x75] = '\0';
      (pCVar15->m_LocalConsole).m_aCompletionBuffer[0x76] = '\0';
      (pCVar15->m_LocalConsole).m_aCompletionBuffer[0x77] = '\0';
    }
  }
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  OnRender::s_LastRender = fVar18;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x10])
            (0x3f800000,pIVar5,&OnRender::s_InfoCursor,0,0xffffffff);
  (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
            (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
  if ((OnRender()::s_Cursor == '\0') &&
     (iVar11 = __cxa_guard_acquire(&OnRender()::s_Cursor), iVar11 != 0)) {
    CTextCursor::CTextCursor(&OnRender::s_Cursor);
    __cxa_atexit(CTextCursor::~CTextCursor,&OnRender::s_Cursor,&__dso_handle);
    __cxa_guard_release(&OnRender()::s_Cursor);
  }
  aVar20.y = aVar20.y + (float)(iVar10 + -1) * -10.0;
  CTextCursor::Reset(&OnRender::s_Cursor,-1);
  OnRender::s_Cursor.m_CursorPos.field_1.y = aVar20.y;
  OnRender::s_Cursor.m_CursorPos.field_0.x = aVar23.x;
  OnRender::s_Cursor.m_FontSize = 10.0;
  OnRender::s_Cursor.m_MaxLines = -1;
  OnRender::s_Cursor.m_MaxWidth = fVar21;
  pCurrent = (float *)CRingBufferBase::Last((CRingBufferBase *)pCVar15);
  if (OnRender()::s_LastActivePage == '\0') {
    OnRender(pCVar15);
  }
  if (OnRender::s_LastActivePage < 0) {
    iVar10 = 1;
  }
  else {
    iVar10 = 1;
    iVar11 = 0;
    while (pCurrent != (float *)0x0) {
      local_2e8 = 0.0;
      while( true ) {
        CTextCursor::Reset(&OnRender::s_Cursor,-1);
        if (*(char *)(pCurrent + 1) == '\x01') {
          (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface
            [4])(0x3f800000,0x3f400000,0x3f400000,0x3f800000);
        }
        pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar5->super_IInterface)._vptr_IInterface[7])
                  (pIVar5,&OnRender::s_Cursor,(long)pCurrent + 5,0xffffffff);
        (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface
          [4])(0x3f800000,0x3f800000,0x3f800000,0x3f800000);
        if (*pCurrent <= 0.0 && *pCurrent != 0.0) {
          *pCurrent = OnRender::s_Cursor.m_NextLineAdvanceY + 1.0;
        }
        local_2e8 = local_2e8 + *pCurrent;
        fVar22 = aVar20.y - local_2e8;
        if (fVar22 <= 12.5) break;
        if (iVar11 == OnRender::s_LastActivePage) {
          OnRender::s_Cursor.m_CursorPos = (vec2)((ulong)(uint)fVar22 << 0x20);
          pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x10])
                    (0x3f800000,pIVar5,&OnRender::s_Cursor,0,0xffffffff);
        }
        pCurrent = (float *)CRingBufferBase::Prev((CRingBufferBase *)pCVar15,pCurrent);
        if (pCurrent == (float *)0x0) goto LAB_0013da72;
      }
      iVar10 = iVar10 + 1;
      bVar7 = OnRender::s_LastActivePage <= iVar11;
      iVar11 = iVar11 + 1;
      if (bVar7) break;
    }
  }
LAB_0013da72:
  aVar20 = (pCVar15->m_LocalConsole).m_Input.m_CaretPosition.field_1;
  OnRender::s_LastActivePage = iVar10 + -1;
  if ((int)aVar20 < iVar10 + -1) {
    OnRender::s_LastActivePage = (int)aVar20;
  }
  if ((int)aVar20 < 0) {
    OnRender::s_LastActivePage = 0;
  }
  (pCVar15->m_LocalConsole).m_Input.m_CaretPosition.field_1 =
       (anon_union_4_2_947302a4_for_vector2_base<float>_3)OnRender::s_LastActivePage;
  CTextCursor::Reset(&OnRender::s_Cursor,-1);
  OnRender::s_Cursor.m_MaxWidth = -1.0;
  pcVar17 = Localize("-Page %d-","");
  str_format(local_288,0x80,pcVar17,
             (ulong)((int)(pCVar15->m_LocalConsole).m_Input.m_CaretPosition.field_1 + 1));
  OnRender::s_Cursor.m_CursorPos.field_0 =
       (anon_union_4_2_94730284_for_vector2_base<float>_1)0x41200000;
  OnRender::s_Cursor.m_CursorPos.field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0xb])
            (pIVar5,&OnRender::s_Cursor,local_288,0xffffffff);
  str_format(local_288,0x80,"v%s","0.7.5");
  CTextCursor::Reset(&OnRender::s_Cursor,-1);
  OnRender::s_Cursor.m_CursorPos.field_1.y = 0.0;
  OnRender::s_Cursor.m_CursorPos.field_0.x = fVar21;
  OnRender::s_Cursor.m_Align = 2;
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0xb])
            (pIVar5,&OnRender::s_Cursor,local_288,0xffffffff);
  OnRender::s_Cursor.m_Align = 0;
LAB_0013db82:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameConsole::OnRender()
{
	CUIRect Screen = *UI()->Screen();
	float ConsoleMaxHeight = Screen.h*3/5.0f;
	float ConsoleHeight;

	const float Now = TimeNow();
	float Progress = (Now - (m_StateChangeEnd - m_StateChangeDuration)) / float(m_StateChangeDuration);

	if(Progress >= 1.0f)
	{
		if(m_ConsoleState == CONSOLE_CLOSING)
		{
			m_ConsoleState = CONSOLE_CLOSED;
			CurrentConsole()->m_Input.Deactivate();
		}
		else if(m_ConsoleState == CONSOLE_OPENING)
		{
			m_ConsoleState = CONSOLE_OPEN;
			CurrentConsole()->m_Input.Activate(CONSOLE);
		}

		Progress = 1.0f;
	}

	if(m_ConsoleState == CONSOLE_OPEN && Config()->m_ClEditor)
		Toggle(CONSOLETYPE_LOCAL);

	if(m_ConsoleState == CONSOLE_CLOSED)
		return;

	if(m_ConsoleState == CONSOLE_OPEN)
		Input()->MouseModeAbsolute();

	float ConsoleHeightScale;

	if(m_ConsoleState == CONSOLE_OPENING)
		ConsoleHeightScale = ConsoleScaleFunc(Progress);
	else if(m_ConsoleState == CONSOLE_CLOSING)
		ConsoleHeightScale = ConsoleScaleFunc(1.0f-Progress);
	else //if(console_state == CONSOLE_OPEN)
		ConsoleHeightScale = ConsoleScaleFunc(1.0f);

	ConsoleHeight = ConsoleHeightScale*ConsoleMaxHeight;

	Graphics()->MapScreen(Screen.x, Screen.y, Screen.w, Screen.h);

	// do console shadow
	Graphics()->TextureClear();
	Graphics()->QuadsBegin();
	IGraphics::CColorVertex Array[4] = {
		IGraphics::CColorVertex(0, 0,0,0, 0.5f),
		IGraphics::CColorVertex(1, 0,0,0, 0.5f),
		IGraphics::CColorVertex(2, 0,0,0, 0.0f),
		IGraphics::CColorVertex(3, 0,0,0, 0.0f)};
	Graphics()->SetColorVertex(Array, 4);
	IGraphics::CQuadItem QuadItem(0, ConsoleHeight, Screen.w, 10.0f);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();

	// do background
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_CONSOLE_BG].m_Id);
	Graphics()->QuadsBegin();
	Graphics()->SetColor(0.2f, 0.2f, 0.2f,0.9f);
	if(m_ConsoleType == CONSOLETYPE_REMOTE)
		Graphics()->SetColor(0.4f, 0.2f, 0.2f,0.9f);
	Graphics()->QuadsSetSubset(0,-ConsoleHeight*0.075f,Screen.w*0.075f*0.5f,0);
	QuadItem = IGraphics::CQuadItem(0, 0, Screen.w, ConsoleHeight);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();

	// do small bar shadow
	Graphics()->TextureClear();
	Graphics()->QuadsBegin();
	Array[0] = IGraphics::CColorVertex(0, 0,0,0, 0.0f);
	Array[1] = IGraphics::CColorVertex(1, 0,0,0, 0.0f);
	Array[2] = IGraphics::CColorVertex(2, 0,0,0, 0.25f);
	Array[3] = IGraphics::CColorVertex(3, 0,0,0, 0.25f);
	Graphics()->SetColorVertex(Array, 4);
	QuadItem = IGraphics::CQuadItem(0, ConsoleHeight-20, Screen.w, 10);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();

	// do the lower bar
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_CONSOLE_BAR].m_Id);
	Graphics()->QuadsBegin();
	Graphics()->SetColor(1.0f, 1.0f, 1.0f, 0.9f);
	Graphics()->QuadsSetSubset(0,0.1f,Screen.w*0.015f,1-0.1f);
	QuadItem = IGraphics::CQuadItem(0,ConsoleHeight-10.0f,Screen.w,10.0f);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();

	ConsoleHeight -= 22.0f;

	CInstance *pConsole = CurrentConsole();

	{
		float FontSize = 10.0f;
		float RowHeight = FontSize*1.25f;
		float x = 3;
		float y = ConsoleHeight - RowHeight - 5.0f;

		static CTextCursor s_InfoCursor;
		s_InfoCursor.Reset();
		s_InfoCursor.MoveTo(x+pConsole->m_CompletionRenderOffset, y+RowHeight+2.0f);
		s_InfoCursor.m_FontSize = FontSize;
		s_InfoCursor.m_MaxWidth = -1.0f;

		// render prompt
		static CTextCursor s_PromptCursor(FontSize);
		s_PromptCursor.MoveTo(x, y);
		const char *pPrompt = "> ";
		if(m_ConsoleType == CONSOLETYPE_REMOTE)
		{
			if(Client()->State() == IClient::STATE_ONLINE || Client()->State() == IClient::STATE_LOADING)
			{
				if(Client()->RconAuthed())
					pPrompt = "rcon> ";
				else
					pPrompt = "ENTER PASSWORD> ";
			}
			else
				pPrompt = "NOT CONNECTED> ";
		}
		s_PromptCursor.Reset((int64)pPrompt);
		TextRender()->TextOutlined(&s_PromptCursor, pPrompt, -1);

		x = s_PromptCursor.AdvancePosition().x;

		// render console input (wrap line)
		pConsole->m_Input.SetHidden(m_ConsoleType == CONSOLETYPE_REMOTE && (Client()->State() == IClient::STATE_ONLINE || Client()->State() == IClient::STATE_LOADING) && !Client()->RconAuthed());
		CTextCursor *pInputCursor = pConsole->m_Input.GetCursor();
		pInputCursor->m_Align = TEXTALIGN_BL;
		pInputCursor->m_MaxLines = -1;
		pInputCursor->m_FontSize = FontSize;
		pInputCursor->m_MaxWidth = Screen.w - 10.0f - x;
		pInputCursor->MoveTo(x, y + FontSize * 1.35f);

		pConsole->m_Input.Activate(CONSOLE); // ensure the input is active
		pConsole->m_Input.Render();

		y -= (pInputCursor->LineCount() - 1) * FontSize;

		// render possible commands
		static float s_LastRender = Now;
		if((m_ConsoleType == CONSOLETYPE_LOCAL || Client()->RconAuthed()) && pConsole->m_Input.GetString()[0])
		{
			CCompletionOptionRenderInfo Info;
			Info.m_pSelf = this;
			Info.m_WantedCompletion = pConsole->m_CompletionChosen;
			Info.m_EnumCount = 0;
			Info.m_Offset = pConsole->m_CompletionRenderOffset;
			Info.m_pOffsetChange = &pConsole->m_CompletionRenderOffsetChange;
			Info.m_Width = Screen.w;
			Info.m_TotalWidth = 0.0f;
			Info.m_pCurrentCmd = pConsole->m_aCompletionBuffer;
			Info.m_pCursor = &s_InfoCursor;
			m_pConsole->PossibleCommands(Info.m_pCurrentCmd, pConsole->m_CompletionFlagmask, m_ConsoleType != CGameConsole::CONSOLETYPE_LOCAL &&
				Client()->RconAuthed() && Client()->UseTempRconCommands(), PossibleCommandsRenderCallback, &Info);

			if(Info.m_EnumCount <= 0 && pConsole->m_IsCommand)
			{
				if(IsMapCommandPrefix(Info.m_pCurrentCmd))
				{
					Info.m_WantedCompletion = pConsole->m_CompletionMapChosen;
					Info.m_EnumCount = 0;
					Info.m_TotalWidth = 0.0f;
					Info.m_pCurrentCmd = pConsole->m_aCompletionMapBuffer;
					m_pConsole->PossibleMaps(Info.m_pCurrentCmd, PossibleCommandsRenderCallback, &Info);
				}

				if(Info.m_EnumCount <= 0 && pConsole->m_IsCommand)
				{
					char aBuf[512];
					str_format(aBuf, sizeof(aBuf), "Help: %s ", pConsole->m_aCommandHelp);
					TextRender()->TextDeferred(Info.m_pCursor, aBuf, -1);
					TextRender()->TextColor(0.75f, 0.75f, 0.75f, 1);
					str_format(aBuf, sizeof(aBuf), "Syntax: %s %s", pConsole->m_aCommandName, pConsole->m_aCommandParams);
					TextRender()->TextDeferred(Info.m_pCursor, aBuf, -1);
				}
			}

			// instant scrolling if distance too long
			if(absolute(pConsole->m_CompletionRenderOffsetChange) > Info.m_Width)
			{
				pConsole->m_CompletionRenderOffset += pConsole->m_CompletionRenderOffsetChange;
				pConsole->m_CompletionRenderOffsetChange = 0.0f;
			}
			// smooth scrolling
			if(pConsole->m_CompletionRenderOffsetChange)
			{
				const float Delta = pConsole->m_CompletionRenderOffsetChange * clamp((Now - s_LastRender) * 10.0f, 0.0f, 1.0f);
				pConsole->m_CompletionRenderOffset += Delta;
				pConsole->m_CompletionRenderOffsetChange -= Delta;
			}
			// clamp to first item
			if(pConsole->m_CompletionRenderOffset > 0.0f)
			{
				pConsole->m_CompletionRenderOffset = 0.0f;
				pConsole->m_CompletionRenderOffsetChange = 0.0f;
			}
			// clamp to last item
			if(Info.m_TotalWidth > Info.m_Width && pConsole->m_CompletionRenderOffset < Info.m_Width - Info.m_TotalWidth)
			{
				pConsole->m_CompletionRenderOffset = Info.m_Width - Info.m_TotalWidth;
				pConsole->m_CompletionRenderOffsetChange = 0.0f;
			}
		}
		s_LastRender = Now;

		TextRender()->DrawTextOutlined(&s_InfoCursor);

		TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);

		// render log (actual page, wrap lines)
		static CTextCursor s_Cursor;
		s_Cursor.Reset();
		s_Cursor.MoveTo(x, y);
		s_Cursor.m_FontSize = FontSize;
		s_Cursor.m_MaxLines = -1;
		s_Cursor.m_MaxWidth = Screen.w - 10.0f;

		CInstance::CBacklogEntry *pEntry = pConsole->m_Backlog.Last();
		float OffsetY = 0.0f;
		const float LineOffset = 1.0f;
		static int s_LastActivePage = pConsole->m_BacklogActPage;
		int TotalPages = 1;
		for(int Page = 0; Page <= s_LastActivePage; ++Page, OffsetY = 0.0f)
		{
			while(pEntry)
			{
				s_Cursor.Reset();
				if(pEntry->m_Highlighted)
					TextRender()->TextColor(1.0f, 0.75f, 0.75f, 1.0f);
				TextRender()->TextDeferred(&s_Cursor, pEntry->m_aText, -1);
				TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);

				// get y offset (calculate it if we haven't yet)
				if(pEntry->m_YOffset < 0.0f)
					pEntry->m_YOffset = s_Cursor.BaseLineY() + LineOffset;
				OffsetY += pEntry->m_YOffset;

				// next page when lines reach the top
				if(y - OffsetY <= RowHeight)
					break;

				// just render output from actual backlog page (render bottom up)
				if(Page == s_LastActivePage)
				{
					s_Cursor.MoveTo(0.0f, y - OffsetY);
					TextRender()->DrawTextOutlined(&s_Cursor);
				}

				pEntry = pConsole->m_Backlog.Prev(pEntry);
			}
			if(!pEntry)
				break;
			TotalPages++;
		}
		pConsole->m_BacklogActPage = clamp(pConsole->m_BacklogActPage, 0, TotalPages - 1);
		s_LastActivePage = pConsole->m_BacklogActPage;

		s_Cursor.Reset();
		s_Cursor.m_MaxWidth = -1;
		// render page
		char aBuf[128];
		str_format(aBuf, sizeof(aBuf), Localize("-Page %d-"), pConsole->m_BacklogActPage+1);
		s_Cursor.MoveTo(10.0f, 0.0f);
		TextRender()->TextOutlined(&s_Cursor, aBuf, -1.0f);

		// render version
		str_format(aBuf, sizeof(aBuf), "v%s", GAME_RELEASE_VERSION);
		s_Cursor.Reset();
		s_Cursor.MoveTo(Screen.w-10.0f, 0.0f);
		s_Cursor.m_Align = TEXTALIGN_RIGHT;
		TextRender()->TextOutlined(&s_Cursor, aBuf, -1.0f);
		s_Cursor.m_Align = TEXTALIGN_LEFT;
	}
}